

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void changeLpMatrixCoefficient
               (HighsLp *lp,HighsInt row,HighsInt col,double new_value,bool zero_new_value)

{
  vector<double,_std::allocator<double>_> *this;
  int *piVar1;
  int iVar2;
  pointer piVar3;
  ulong uVar4;
  pointer pdVar5;
  ulong uVar6;
  pointer piVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> *this_00;
  ulong uVar9;
  long lVar10;
  HighsInt i;
  long lVar11;
  
  lVar11 = (long)col;
  piVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)piVar3[lVar11];
  lVar8 = (long)piVar3[lVar11 + 1];
  lVar11 = lVar11 + 1;
  this_00 = &(lp->a_matrix_).index_;
  lVar10 = uVar4 << 0x20;
  do {
    if (lVar8 <= (long)uVar4) {
LAB_0025f5c5:
      if (!zero_new_value) {
        lVar10 = (long)piVar3[lp->num_col_];
        std::vector<int,_std::allocator<int>_>::resize(this_00,lVar10 + 1U);
        this = &(lp->a_matrix_).value_;
        std::vector<double,_std::allocator<double>_>::resize(this,lVar10 + 1U);
        piVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (; lVar11 <= lp->num_col_; lVar11 = lVar11 + 1) {
          piVar1 = piVar3 + lVar11;
          *piVar1 = *piVar1 + 1;
        }
        piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (; lVar8 < lVar10; lVar10 = lVar10 + -1) {
          piVar7[lVar10] = piVar7[lVar10 + -1];
          pdVar5[lVar10] = pdVar5[lVar10 + -1];
        }
LAB_0025f65c:
        piVar7[lVar8] = row;
        pdVar5[lVar8] = new_value;
      }
      return;
    }
    if (piVar7[uVar4] == row) {
      if (-1 < (long)uVar4) {
        if (zero_new_value) {
          uVar6 = (ulong)lp->num_col_;
          iVar2 = piVar3[uVar6];
          for (; lVar11 <= (int)uVar6; lVar11 = lVar11 + 1) {
            piVar3[lVar11] = piVar3[lVar11] + -1;
            uVar6 = (ulong)(uint)lp->num_col_;
          }
          piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar6 = uVar4 & 0xffffffff;
          while( true ) {
            uVar9 = uVar6 + 1;
            if (iVar2 + -1 <= (int)uVar4) break;
            piVar3[uVar6] = piVar3[uVar9];
            pdVar5[uVar6] = pdVar5[uVar9];
            uVar4 = (ulong)((int)uVar4 + 1);
            uVar6 = uVar9;
          }
          return;
        }
        pdVar5 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = lVar10 >> 0x20;
        goto LAB_0025f65c;
      }
      goto LAB_0025f5c5;
    }
    uVar4 = uVar4 + 1;
    lVar10 = lVar10 + 0x100000000;
  } while( true );
}

Assistant:

void changeLpMatrixCoefficient(HighsLp& lp, const HighsInt row,
                               const HighsInt col, const double new_value,
                               const bool zero_new_value) {
  assert(0 <= row && row < lp.num_row_);
  assert(0 <= col && col < lp.num_col_);

  // Determine whether the coefficient corresponds to an existing
  // nonzero
  HighsInt change_el = -1;
  for (HighsInt el = lp.a_matrix_.start_[col];
       el < lp.a_matrix_.start_[col + 1]; el++) {
    if (lp.a_matrix_.index_[el] == row) {
      change_el = el;
      break;
    }
  }
  if (change_el < 0) {
    // Coefficient doesn't correspond to an existing nonzero
    //
    // If coefficient is small, then just ignore it
    if (zero_new_value) return;
    // New nonzero goes at the end of column "col", so have to shift
    // all index and value entries forward by 1 to accommodate it
    change_el = lp.a_matrix_.start_[col + 1];
    HighsInt new_num_nz = lp.a_matrix_.start_[lp.num_col_] + 1;
    lp.a_matrix_.index_.resize(new_num_nz);
    lp.a_matrix_.value_.resize(new_num_nz);
    for (HighsInt i = col + 1; i <= lp.num_col_; i++) lp.a_matrix_.start_[i]++;
    for (HighsInt el = new_num_nz - 1; el > change_el; el--) {
      lp.a_matrix_.index_[el] = lp.a_matrix_.index_[el - 1];
      lp.a_matrix_.value_[el] = lp.a_matrix_.value_[el - 1];
    }
  } else if (zero_new_value) {
    // Coefficient zeroes an existing nonzero, so shift all index and
    // value entries backward by 1 to eliminate it
    HighsInt new_num_nz = lp.a_matrix_.start_[lp.num_col_] - 1;
    for (HighsInt i = col + 1; i <= lp.num_col_; i++) lp.a_matrix_.start_[i]--;
    for (HighsInt el = change_el; el < new_num_nz; el++) {
      lp.a_matrix_.index_[el] = lp.a_matrix_.index_[el + 1];
      lp.a_matrix_.value_[el] = lp.a_matrix_.value_[el + 1];
    }
    return;
  }
  lp.a_matrix_.index_[change_el] = row;
  lp.a_matrix_.value_[change_el] = new_value;
}